

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration_object.c
# Opt level: O3

int configuration_object_childs_cb_iterate(set s,set_key key,set_value val,set_cb_iterate_args args)

{
  int iVar1;
  set_value pvVar2;
  char *path;
  int iVar3;
  value v;
  configuration_childs_cb_iterator iterator;
  configuration child;
  configuration local_28;
  
  iVar1 = configuration_object_childs_cb_iterate_valid(s,val);
  iVar3 = 0;
  if (iVar1 == 0) {
    pvVar2 = set_get(*(set *)((long)args + 0x18),key);
    iVar3 = 0;
    if (pvVar2 == (set_value)0x0) {
      path = value_to_string(val);
      local_28 = configuration_object_initialize
                           ((char *)key,path,*(configuration *)((long)args + 8));
      if (local_28 == (configuration)0x0) {
        *(undefined4 *)args = 1;
        iVar3 = 1;
      }
      else {
        vector_push_back(*(vector *)((long)args + 0x10),&local_28);
      }
    }
  }
  return iVar3;
}

Assistant:

int configuration_object_childs_cb_iterate(set s, set_key key, set_value val, set_cb_iterate_args args)
{
	(void)s;

	if (configuration_object_childs_cb_iterate_valid(key, val) == 0)
	{
		configuration_childs_cb_iterator iterator = args;

		if (set_get(iterator->storage, key) == NULL)
		{
			value v = val;

			const char *path = value_to_string(v);

			configuration child = configuration_object_initialize(key, path, iterator->parent);

			if (child == NULL)
			{
				iterator->result = 1;

				return 1;
			}

			vector_push_back(iterator->childs, &child);
		}
	}

	return 0;
}